

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jedi.cpp
# Opt level: O1

int displayMessage(char *msg_buffer)

{
  char cVar1;
  long lVar2;
  long in_RAX;
  size_t sVar3;
  char *c;
  char *__dest;
  char *pcVar4;
  ulong uVar5;
  char *pcVar6;
  int iVar7;
  long lVar8;
  int y;
  int x;
  ulong uVar9;
  undefined8 uStack_40;
  undefined8 local_38;
  int width;
  int line_count;
  
  uStack_40 = 0x11ee6e;
  local_38 = in_RAX;
  sVar3 = strlen(msg_buffer);
  lVar2 = -(sVar3 + 0x2f & 0xfffffffffffffff0);
  __dest = (char *)((long)&local_38 + lVar2);
  *(undefined8 *)((long)&uStack_40 + lVar2) = 0x11ee8a;
  strcpy(__dest,msg_buffer);
  *(undefined8 *)((long)&uStack_40 + lVar2) = 0x11eeac;
  lineWrapString(__dest,0x15,"",(int *)&local_38,(int *)((long)&local_38 + 4));
  *(undefined8 *)((long)&uStack_40 + lVar2) = 0x11eeb1;
  drawMap();
  iVar7 = (int)local_38 * -4 + 0x80 >> 1;
  y = local_38._4_4_ * -6 + 0x40 >> 1;
  if (-1 < (int)local_38) {
    pcVar6 = prname::tbuf + (long)y * 0x80 + (long)iVar7 + 0x2fe;
    uVar9 = 0;
    do {
      if (-1 < local_38) {
        lVar8 = 0;
        do {
          pcVar6[lVar8] = -1;
          lVar8 = lVar8 + 0x80;
        } while ((ulong)(local_38._4_4_ * 6 + 4) * 0x80 + 0x80 != lVar8);
      }
      uVar9 = uVar9 + 1;
      pcVar6 = pcVar6 + 1;
    } while (uVar9 != (int)local_38 * 4 + 4);
  }
  x = iVar7;
  if (-1 < (int)local_38) {
    pcVar6 = prname::tbuf + (long)y * 0x80 + (long)iVar7 + 0x37f;
    uVar9 = 0;
    do {
      pcVar4 = pcVar6;
      uVar5 = (ulong)(local_38._4_4_ * 6 + 2);
      if (-1 < local_38) {
        do {
          *pcVar4 = '\0';
          pcVar4 = pcVar4 + 0x80;
          uVar5 = uVar5 - 1;
        } while (uVar5 != 0);
      }
      uVar9 = uVar9 + 1;
      pcVar6 = pcVar6 + 1;
    } while (uVar9 != ((int)local_38 * 4 | 2));
  }
  do {
    cVar1 = *__dest;
    if (cVar1 == '\n') {
      y = y + 6;
      x = iVar7;
    }
    else {
      if (cVar1 == '\0') {
        *(undefined8 *)((long)&uStack_40 + lVar2) = 0x11efae;
        refreshDisplay();
        *(undefined8 *)((long)&uStack_40 + lVar2) = 0x11efb3;
        iVar7 = md_readchar();
        *(undefined8 *)((long)&uStack_40 + lVar2) = 0x11efba;
        drawMap();
        *(undefined8 *)((long)&uStack_40 + lVar2) = 0x11efbf;
        refreshDisplay();
        return iVar7;
      }
      *(undefined8 *)((long)&uStack_40 + lVar2) = 0x11ef97;
      drawChar(x,y,(int)cVar1);
      x = x + 4;
    }
    __dest = __dest + 1;
  } while( true );
}

Assistant:

int displayMessage(const char* msg_buffer)
{
    char buffer[strlen(msg_buffer) + 32];
    strcpy(buffer, msg_buffer);
    
    int max_line_width = (DISPLAY_WIDTH * 2 / 3) / 4;
    int width, line_count;
    lineWrapString(buffer, max_line_width, "", &width, &line_count);
    
    drawMap();
    int x = (DISPLAY_WIDTH - width * 4) / 2;
    int y = (DISPLAY_HEIGHT - line_count * 6) / 2;
    int sx = x;
    fillBox(x - 2, y - 2, width * 4 + 4, line_count * 6 + 5, 255);
    fillBox(x - 1, y - 1, width * 4 + 2, line_count * 6 + 2, 0);
    for(const char* c=buffer; *c; c++)
    {
        if (*c == '\n')
        {
            x = sx;
            y += 6;
        }else{
            drawChar(x, y, *c);
            x += 4;
        }
    }
    
    refreshDisplay();
    int ch = md_readchar();
    refreshMap();
    return ch;
}